

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  string *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined1 auVar2 [8];
  undefined8 uVar3;
  size_t sVar4;
  ostream *poVar5;
  TestPartResult *pTVar6;
  long *plVar7;
  int line;
  _func_int **pp_Var8;
  TimeInMillis ms;
  long lVar9;
  char *pcVar10;
  int i;
  int iVar11;
  pointer pcVar12;
  undefined1 local_a0 [8];
  string message;
  long local_70;
  undefined1 local_60 [8];
  string location;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"    <testcase name=\"",0x14);
  EscapeXml((XmlUnitTestResultPrinter *)local_60,(test_info->name_)._M_dataplus._M_p,true);
  auVar2 = local_60;
  if (local_60 == (undefined1  [8])0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar4 = strlen((char *)local_60);
    std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)auVar2,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\"",1);
  if (local_60 != (undefined1  [8])0x0) {
    operator_delete__((void *)local_60);
  }
  pbVar1 = (test_info->value_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>(stream," value_param=\"",0xe);
    pbVar1 = (test_info->value_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = (char *)0x0;
    }
    else {
      pcVar12 = (pbVar1->_M_dataplus)._M_p;
    }
    location.field_2._8_8_ = test_case_name;
    EscapeXml((XmlUnitTestResultPrinter *)local_60,pcVar12,true);
    auVar2 = local_60;
    if (local_60 == (undefined1  [8])0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"(null)",6);
    }
    else if (location._M_dataplus._M_p != (pointer)0x0) {
      pcVar12 = (pointer)0x0;
      do {
        if (*(char *)((long)auVar2 + (long)pcVar12) == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(stream,"\\0",2);
        }
        else {
          local_a0[0] = *(char *)((long)auVar2 + (long)pcVar12);
          std::__ostream_insert<char,std::char_traits<char>>(stream,local_a0,1);
        }
        pcVar12 = pcVar12 + 1;
      } while (pcVar12 != location._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\"",1);
    test_case_name = (char *)location.field_2._8_8_;
    if (local_60 != (undefined1  [8])0x0) {
      operator_delete__((void *)local_60);
      test_case_name = (char *)location.field_2._8_8_;
    }
  }
  pbVar1 = (test_info->type_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>(stream," type_param=\"",0xd);
    pbVar1 = (test_info->type_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = (char *)0x0;
    }
    else {
      pcVar12 = (pbVar1->_M_dataplus)._M_p;
    }
    location.field_2._8_8_ = test_case_name;
    EscapeXml((XmlUnitTestResultPrinter *)local_60,pcVar12,true);
    auVar2 = local_60;
    if (local_60 == (undefined1  [8])0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"(null)",6);
    }
    else if (location._M_dataplus._M_p != (pointer)0x0) {
      pcVar12 = (pointer)0x0;
      do {
        if (*(char *)((long)auVar2 + (long)pcVar12) == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(stream,"\\0",2);
        }
        else {
          local_a0[0] = *(char *)((long)auVar2 + (long)pcVar12);
          std::__ostream_insert<char,std::char_traits<char>>(stream,local_a0,1);
        }
        pcVar12 = pcVar12 + 1;
      } while (pcVar12 != location._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\"",1);
    test_case_name = (char *)location.field_2._8_8_;
    if (local_60 != (undefined1  [8])0x0) {
      operator_delete__((void *)local_60);
      test_case_name = (char *)location.field_2._8_8_;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream," status=\"",9);
  pcVar10 = "notrun";
  if ((ulong)test_info->should_run_ != 0) {
    pcVar10 = "run";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,pcVar10,((ulong)test_info->should_run_ ^ 1) * 3 + 3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\" time=\"",8);
  FormatTimeInMillisAsSeconds_abi_cxx11_
            ((string *)local_60,(internal *)(test_info->result_).elapsed_time_,ms);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_60,(long)location._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" classname=\"",0xd);
  EscapeXml((XmlUnitTestResultPrinter *)local_a0,test_case_name,true);
  auVar2 = local_a0;
  if (local_a0 == (undefined1  [8])0x0) {
    std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
  }
  else {
    sVar4 = strlen((char *)local_a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)auVar2,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
  TestPropertiesAsXmlAttributes
            ((XmlUnitTestResultPrinter *)((long)&message.field_2 + 8),&test_info->result_);
  uVar3 = message.field_2._8_8_;
  if (message.field_2._8_8_ == 0) {
    std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
  }
  else {
    sVar4 = strlen((char *)message.field_2._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)uVar3,sVar4);
  }
  if (message.field_2._8_8_ != 0) {
    operator_delete__((void *)message.field_2._8_8_);
  }
  if (local_a0 != (undefined1  [8])0x0) {
    operator_delete__((void *)local_a0);
  }
  if (local_60 != (undefined1  [8])&location._M_string_length) {
    operator_delete((void *)local_60,location._M_string_length + 1);
  }
  if (0 < (int)((ulong)((long)(test_info->result_).test_part_results_.
                              super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(test_info->result_).test_part_results_.
                             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    i = 0;
    __return_storage_ptr__ = (string *)(message.field_2._M_local_buf + 8);
    iVar11 = 0;
    location.field_2._8_8_ = stream;
    do {
      line = (int)test_info;
      pTVar6 = TestResult::GetTestPartResult(&test_info->result_,i);
      if (pTVar6->type_ != kSuccess) {
        if (iVar11 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)location.field_2._8_8_,">\n",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"      <failure message=\"",0x18);
        EscapeXml((XmlUnitTestResultPrinter *)local_60,(pTVar6->summary_).c_str_,true);
        auVar2 = local_60;
        if (local_60 == (undefined1  [8])0x0) {
          std::ios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
        }
        else {
          sVar4 = strlen((char *)local_60);
          std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)auVar2,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"\" type=\"\">",10);
        if (local_60 != (undefined1  [8])0x0) {
          operator_delete__((void *)local_60);
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  ((string *)local_60,(internal *)(pTVar6->file_name_).c_str_,
                   (char *)(ulong)(uint)pTVar6->line_number_,line);
        message.field_2._8_8_ = &stack0xffffffffffffff90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_60,
                   location._M_dataplus._M_p + (long)local_60);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        plVar7 = (long *)std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar3 = location.field_2._8_8_;
        pp_Var8 = (_func_int **)(plVar7 + 2);
        if ((_func_int **)*plVar7 == pp_Var8) {
          message._M_string_length = (size_type)*pp_Var8;
          message.field_2._M_allocated_capacity = plVar7[3];
          local_a0 = (undefined1  [8])&message._M_string_length;
        }
        else {
          message._M_string_length = (size_type)*pp_Var8;
          local_a0 = (undefined1  [8])*plVar7;
        }
        message._M_dataplus._M_p = (pointer)plVar7[1];
        *plVar7 = (long)pp_Var8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((long *)message.field_2._8_8_ != &stack0xffffffffffffff90) {
          operator_delete((void *)message.field_2._8_8_,local_70 + 1);
        }
        RemoveInvalidXmlCharacters(__return_storage_ptr__,(string *)local_a0);
        OutputXmlCDataSection((ostream *)uVar3,(char *)message.field_2._8_8_);
        if ((long *)message.field_2._8_8_ != &stack0xffffffffffffff90) {
          operator_delete((void *)message.field_2._8_8_,local_70 + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)uVar3,"</failure>\n",0xb);
        if (local_a0 != (undefined1  [8])&message._M_string_length) {
          operator_delete((void *)local_a0,message._M_string_length + 1);
        }
        if (local_60 != (undefined1  [8])&location._M_string_length) {
          operator_delete((void *)local_60,location._M_string_length + 1);
        }
        iVar11 = iVar11 + 1;
      }
      i = i + 1;
    } while (i < (int)((ulong)((long)(test_info->result_).test_part_results_.
                                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(test_info->result_).test_part_results_.
                                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 6));
    stream = (ostream *)location.field_2._8_8_;
    if (iVar11 != 0) {
      pcVar10 = "    </testcase>\n";
      lVar9 = 0x10;
      goto LAB_0012005f;
    }
  }
  pcVar10 = " />\n";
  lVar9 = 4;
LAB_0012005f:
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar10,lVar9);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  *stream << "    <testcase name=\""
          << EscapeXmlAttribute(test_info.name()).c_str() << "\"";

  if (test_info.value_param() != NULL) {
    *stream << " value_param=\"" << EscapeXmlAttribute(test_info.value_param())
            << "\"";
  }
  if (test_info.type_param() != NULL) {
    *stream << " type_param=\"" << EscapeXmlAttribute(test_info.type_param())
            << "\"";
  }

  *stream << " status=\""
          << (test_info.should_run() ? "run" : "notrun")
          << "\" time=\""
          << FormatTimeInMillisAsSeconds(result.elapsed_time())
          << "\" classname=\"" << EscapeXmlAttribute(test_case_name).c_str()
          << "\"" << TestPropertiesAsXmlAttributes(result).c_str();

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1)
        *stream << ">\n";
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(part.summary()).c_str()
              << "\" type=\"\">";
      const string location = internal::FormatCompilerIndependentFileLocation(
          part.file_name(), part.line_number());
      const string message = location + "\n" + part.message();
      OutputXmlCDataSection(stream,
                            RemoveInvalidXmlCharacters(message).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}